

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestBase.cpp
# Opt level: O2

void Tests::Cleanup(void)

{
  undefined8 *puVar1;
  uint i;
  ulong uVar2;
  
  puVar1 = &expressionEvaluionFailInfo;
  for (uVar2 = 0; uVar2 < expressionEvaluionFails; uVar2 = uVar2 + 1) {
    free((void *)*puVar1);
    puVar1 = puVar1 + 2;
  }
  expressionEvaluionFails = 0;
  puVar1 = &instructionEvaluionFailInfo;
  for (uVar2 = 0; uVar2 < instructionEvaluionFails; uVar2 = uVar2 + 1) {
    free((void *)*puVar1);
    puVar1 = puVar1 + 2;
  }
  instructionEvaluionFails = 0;
  return;
}

Assistant:

void Tests::Cleanup()
{
	for(unsigned i = 0; i < expressionEvaluionFails; i++)
		free(expressionEvaluionFailInfo[i].reason);
	expressionEvaluionFails = 0;

	for(unsigned i = 0; i < instructionEvaluionFails; i++)
		free(instructionEvaluionFailInfo[i].reason);
	instructionEvaluionFails = 0;
}